

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmNinjaNormalTargetGenerator::ComputeLinkCmd
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmNinjaNormalTargetGenerator *this,string *config)

{
  bool bVar1;
  TargetType TVar2;
  cmMakefile *this_00;
  cmGeneratorTarget *pcVar3;
  cmLocalNinjaGenerator *pcVar4;
  string *psVar5;
  container_type *pcVar6;
  string_view sVar7;
  string *linkCmd_2;
  string local_358;
  string local_338;
  undefined1 local_318 [8];
  string linkCmdVar_2;
  string *linkCmd_1;
  string local_2c8;
  string local_2a8;
  undefined1 local_288 [8];
  string linkCmdVar_1;
  undefined1 local_238 [8];
  string cmakeCommand_1;
  string local_210;
  string local_1f0;
  undefined1 local_1d0 [8];
  string targetOutputReal;
  string local_1a0;
  string_view local_180;
  string local_170;
  undefined1 local_150 [8];
  string cmakeCommand;
  string local_128;
  cmValue local_108;
  cmValue lwyuCheck;
  cmValue rule;
  undefined1 local_d8 [8];
  string ruleVar;
  string linkCmdStr;
  cmValue linkCmd;
  undefined1 local_70 [8];
  string linkCmdVar;
  cmMakefile *mf;
  cmList linkCmds;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  linkCmds.Values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = config;
  cmList::cmList((cmList *)&mf);
  this_00 = cmNinjaTargetGenerator::GetMakefile(&this->super_cmNinjaTargetGenerator);
  pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  TargetLinkLanguage((string *)&linkCmd,this,
                     linkCmds.Values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cmGeneratorTarget::GetCreateRuleVariable
            ((string *)local_70,pcVar3,(string *)&linkCmd,
             linkCmds.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&linkCmd);
  linkCmdStr.field_2._8_8_ = cmMakefile::GetDefinition(this_00,(string *)local_70);
  bVar1 = cmValue::operator_cast_to_bool((cmValue *)((long)&linkCmdStr.field_2 + 8));
  if (bVar1) {
    psVar5 = cmValue::operator*[abi_cxx11_((cmValue *)((long)&linkCmdStr.field_2 + 8));
    std::__cxx11::string::string((string *)(ruleVar.field_2._M_local_buf + 8),(string *)psVar5);
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    bVar1 = cmGeneratorTarget::HasImplibGNUtoMS
                      (pcVar3,linkCmds.Values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      cmGeneratorTarget::GetLinkerLanguage
                ((string *)&rule,
                 (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget,
                 linkCmds.Values.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmStrCat<char_const(&)[7],std::__cxx11::string,char_const(&)[14]>
                ((string *)local_d8,(char (*) [7])0x11240fa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rule,
                 (char (*) [14])"_GNUtoMS_RULE");
      std::__cxx11::string::~string((string *)&rule);
      lwyuCheck = cmMakefile::GetDefinition
                            ((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.
                             Makefile,(string *)local_d8);
      bVar1 = cmValue::operator_cast_to_bool(&lwyuCheck);
      if (bVar1) {
        psVar5 = cmValue::operator*[abi_cxx11_(&lwyuCheck);
        std::__cxx11::string::operator+=
                  ((string *)(ruleVar.field_2._M_local_buf + 8),(string *)psVar5);
      }
      std::__cxx11::string::~string((string *)local_d8);
    }
    cmList::assign((cmList *)&mf,(string *)((long)&ruleVar.field_2 + 8),Yes,No);
    if (((this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.UseLWYU & 1U) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,"CMAKE_LINK_WHAT_YOU_USE_CHECK",
                 (allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf));
      local_108 = cmMakefile::GetDefinition(this_00,&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      std::allocator<char>::~allocator((allocator<char> *)(cmakeCommand.field_2._M_local_buf + 0xf))
      ;
      bVar1 = cmValue::operator_cast_to_bool(&local_108);
      if (bVar1) {
        pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        local_180 = (string_view)
                    std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  (&local_170,(cmOutputConverter *)pcVar4,local_180,SHELL,false);
        cmStrCat<std::__cxx11::string,char_const(&)[29]>
                  ((string *)local_150,&local_170,(char (*) [29])" -E __run_co_compile --lwyu=");
        std::__cxx11::string::~string((string *)&local_170);
        pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar5 = cmValue::operator*[abi_cxx11_(&local_108);
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
        targetOutputReal.field_2._8_8_ = sVar7._M_len;
        cmOutputConverter::EscapeForShell_abi_cxx11_
                  (&local_1a0,(cmOutputConverter *)pcVar4,sVar7,false,false,false,false,false);
        std::__cxx11::string::operator+=((string *)local_150,(string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1a0);
        pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
        cmGeneratorTarget::GetFullPath
                  (&local_1f0,pcVar3,
                   linkCmds.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,RuntimeBinaryArtifact,true);
        psVar5 = cmNinjaTargetGenerator::ConvertToNinjaPath
                           (&this->super_cmNinjaTargetGenerator,&local_1f0);
        std::__cxx11::string::string((string *)local_1d0,(string *)psVar5);
        std::__cxx11::string::~string((string *)&local_1f0);
        cmStrCat<char_const(&)[11],std::__cxx11::string&>
                  (&local_210,(char (*) [11])" --source=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d0);
        std::__cxx11::string::operator+=((string *)local_150,(string *)&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        cmList::push_back((cmList *)&mf,(string *)local_150);
        std::__cxx11::string::~string((string *)local_1d0);
        std::__cxx11::string::~string((string *)local_150);
      }
    }
    pcVar6 = cmList::data_abi_cxx11_((cmList *)&mf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,pcVar6);
    cmakeCommand_1.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)(ruleVar.field_2._M_local_buf + 8));
  }
  else {
    cmakeCommand_1.field_2._12_4_ = 0;
  }
  std::__cxx11::string::~string((string *)local_70);
  if (cmakeCommand_1.field_2._12_4_ == 0) {
    pcVar3 = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
    TVar2 = cmGeneratorTarget::GetType(pcVar3);
    if (TVar2 != EXECUTABLE) {
      if (TVar2 == STATIC_LIBRARY) {
        pcVar4 = cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
        psVar5 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        sVar7 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar5);
        cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                  ((string *)local_238,(cmOutputConverter *)pcVar4,sVar7,SHELL,false);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&linkCmdVar_1.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_238," -E rm -f $TARGET_FILE");
        cmList::push_back((cmList *)&mf,(string *)((long)&linkCmdVar_1.field_2 + 8));
        std::__cxx11::string::~string((string *)(linkCmdVar_1.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)local_238);
        TargetLinkLanguage(&local_2a8,this,
                           linkCmds.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmStrCat<char_const(&)[7],std::__cxx11::string,char_const(&)[16]>
                  ((string *)local_288,(char (*) [7])0x11240fa,&local_2a8,
                   (char (*) [16])"_ARCHIVE_CREATE");
        std::__cxx11::string::~string((string *)&local_2a8);
        pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
        TargetLinkLanguage((string *)&linkCmd_1,this,
                           linkCmds.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                  (&local_2c8,pcVar3,(string *)local_288,(string *)&linkCmd_1,
                   linkCmds.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)local_288,(string *)&local_2c8);
        std::__cxx11::string::~string((string *)&local_2c8);
        std::__cxx11::string::~string((string *)&linkCmd_1);
        psVar5 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_288);
        linkCmdVar_2.field_2._8_8_ = cmList::append((cmList *)&mf,psVar5,Yes,No);
        std::__cxx11::string::~string((string *)local_288);
        TargetLinkLanguage(&local_338,this,
                           linkCmds.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmStrCat<char_const(&)[7],std::__cxx11::string,char_const(&)[16]>
                  ((string *)local_318,(char (*) [7])0x11240fa,&local_338,
                   (char (*) [16])"_ARCHIVE_FINISH");
        std::__cxx11::string::~string((string *)&local_338);
        pcVar3 = (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget;
        TargetLinkLanguage((string *)&linkCmd_2,this,
                           linkCmds.Values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
        cmGeneratorTarget::GetFeatureSpecificLinkRuleVariable
                  (&local_358,pcVar3,(string *)local_318,(string *)&linkCmd_2,
                   linkCmds.Values.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::operator=((string *)local_318,(string *)&local_358);
        std::__cxx11::string::~string((string *)&local_358);
        std::__cxx11::string::~string((string *)&linkCmd_2);
        psVar5 = cmMakefile::GetRequiredDefinition(this_00,(string *)local_318);
        cmList::append((cmList *)&mf,psVar5,Yes,No);
        std::__cxx11::string::~string((string *)local_318);
      }
      else if (1 < TVar2 - SHARED_LIBRARY) {
        __assert_fail("false && \"Unexpected target type\"",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmNinjaNormalTargetGenerator.cxx"
                      ,0x316,
                      "std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(const std::string &)"
                     );
      }
    }
    pcVar6 = cmList::data_abi_cxx11_((cmList *)&mf);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,pcVar6);
    cmakeCommand_1.field_2._12_4_ = 1;
  }
  cmList::~cmList((cmList *)&mf);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmNinjaNormalTargetGenerator::ComputeLinkCmd(
  const std::string& config)
{
  cmList linkCmds;
  cmMakefile* mf = this->GetMakefile();
  {
    // If we have a rule variable prefer it. In the case of static libraries
    // this occurs when things like IPO is enabled, and we need to use the
    // CMAKE_<lang>_CREATE_STATIC_LIBRARY_IPO define instead.
    std::string linkCmdVar = this->GetGeneratorTarget()->GetCreateRuleVariable(
      this->TargetLinkLanguage(config), config);
    cmValue linkCmd = mf->GetDefinition(linkCmdVar);
    if (linkCmd) {
      std::string linkCmdStr = *linkCmd;
      if (this->GetGeneratorTarget()->HasImplibGNUtoMS(config)) {
        std::string ruleVar =
          cmStrCat("CMAKE_", this->GeneratorTarget->GetLinkerLanguage(config),
                   "_GNUtoMS_RULE");
        if (cmValue rule = this->Makefile->GetDefinition(ruleVar)) {
          linkCmdStr += *rule;
        }
      }
      linkCmds.assign(linkCmdStr);
      if (this->UseLWYU) {
        cmValue lwyuCheck = mf->GetDefinition("CMAKE_LINK_WHAT_YOU_USE_CHECK");
        if (lwyuCheck) {
          std::string cmakeCommand = cmStrCat(
            this->GetLocalGenerator()->ConvertToOutputFormat(
              cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL),
            " -E __run_co_compile --lwyu=");
          cmakeCommand +=
            this->GetLocalGenerator()->EscapeForShell(*lwyuCheck);

          std::string targetOutputReal =
            this->ConvertToNinjaPath(this->GetGeneratorTarget()->GetFullPath(
              config, cmStateEnums::RuntimeBinaryArtifact,
              /*realname=*/true));
          cmakeCommand += cmStrCat(" --source=", targetOutputReal);
          linkCmds.push_back(std::move(cmakeCommand));
        }
      }
      return std::move(linkCmds.data());
    }
  }
  switch (this->GetGeneratorTarget()->GetType()) {
    case cmStateEnums::STATIC_LIBRARY: {
      // We have archive link commands set. First, delete the existing archive.
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E rm -f $TARGET_FILE");
      }
      // TODO: Use ARCHIVE_APPEND for archives over a certain size.
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_CREATE");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        linkCmds.append(linkCmd);
      }
      {
        std::string linkCmdVar = cmStrCat(
          "CMAKE_", this->TargetLinkLanguage(config), "_ARCHIVE_FINISH");

        linkCmdVar = this->GeneratorTarget->GetFeatureSpecificLinkRuleVariable(
          linkCmdVar, this->TargetLinkLanguage(config), config);

        std::string const& linkCmd = mf->GetRequiredDefinition(linkCmdVar);
        linkCmds.append(linkCmd);
      }
#ifdef __APPLE__
      // On macOS ranlib truncates the fractional part of the static archive
      // file modification time.  If the archive and at least one contained
      // object file were created within the same second this will make look
      // the archive older than the object file. On subsequent ninja runs this
      // leads to re-achiving and updating dependent targets.
      // As a work-around we touch the archive after ranlib (see #19222).
      {
        std::string cmakeCommand =
          this->GetLocalGenerator()->ConvertToOutputFormat(
            cmSystemTools::GetCMakeCommand(), cmOutputConverter::SHELL);
        linkCmds.push_back(cmakeCommand + " -E touch $TARGET_FILE");
      }
#endif
    } break;
    case cmStateEnums::SHARED_LIBRARY:
    case cmStateEnums::MODULE_LIBRARY:
    case cmStateEnums::EXECUTABLE:
      break;
    default:
      assert(false && "Unexpected target type");
  }
  return std::move(linkCmds.data());
}